

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

size_t quantize_iq1_m(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  long in_RCX;
  long in_RDX;
  int64_t row;
  char *qrow;
  int64_t nblock;
  int8_t shifts [16];
  uint16_t index [2];
  float pairs [32];
  int8_t L [16];
  float weight [16];
  float scales [16];
  long local_180;
  
  if (in_RCX % 0x100 != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c"
               ,0x11bf,"GGML_ASSERT(%s) failed","n_per_row%QK_K == 0");
  }
  for (local_180 = 0; local_180 < in_RDX; local_180 = local_180 + 1) {
    quantize_row_iq1_m_impl
              ((float *)pairs._64_8_,(void *)pairs._56_8_,pairs._48_8_,(float *)pairs._40_8_,
               (float *)pairs._32_8_,(float *)pairs._24_8_,(float *)pairs._80_8_,
               (int8_t *)pairs._88_8_,(uint16_t *)pairs._96_8_,(int8_t *)pairs._104_8_);
  }
  return in_RDX * (in_RCX / 0x100) * 0x38;
}

Assistant:

size_t quantize_iq1_m(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    GGML_ASSERT(n_per_row%QK_K == 0);
    float  scales[QK_K/IQ1M_BLOCK_SIZE];
    float  weight[IQ1M_BLOCK_SIZE];
    int8_t L[IQ1M_BLOCK_SIZE];
    float  pairs[2*IQ1M_BLOCK_SIZE];
    uint16_t index[IQ1M_BLOCK_SIZE/8];
    int8_t shifts[QK_K/IQ1M_BLOCK_SIZE];
    int64_t nblock = n_per_row/QK_K;
    char * qrow = (char *)dst;
    for (int64_t row = 0; row < nrow; ++row) {
        quantize_row_iq1_m_impl(src, qrow, n_per_row, quant_weights, scales, weight, pairs, L, index, shifts);
        src += n_per_row;
        qrow += nblock*sizeof(block_iq1_m);
    }
    return nrow * nblock * sizeof(block_iq1_m);
}